

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O1

void run_init_quads_task(parallel_task_1d *task,size_t thread_id)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  work_item *pwVar7;
  long lVar8;
  work_item *pwVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  init_primitives_task *init_primitives_task;
  float *pfVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  uVar14 = (task->range).begin;
  uVar6 = (task->range).end;
  lVar15 = uVar6 - uVar14;
  if (uVar14 <= uVar6 && lVar15 != 0) {
    pwVar7 = task[1].work_item.next;
    lVar8 = *(long *)(pwVar7[1].work_fn + 8);
    pfVar16 = (float *)(task[1].work_item.work_fn + uVar14 * 0x48 + 0x44);
    uVar14 = uVar14 << 5 | 0x18;
    do {
      pwVar9 = pwVar7->next;
      lVar10 = *(long *)((long)pwVar9 + (uVar14 - 0x18));
      lVar11 = *(long *)((long)&pwVar9[-1].work_fn + uVar14);
      lVar12 = *(long *)((long)pwVar9 + (uVar14 - 8));
      lVar13 = *(long *)((long)&pwVar9->work_fn + uVar14);
      uVar4 = *(undefined8 *)(lVar8 + lVar10 * 0xc);
      fVar19 = *(float *)(lVar8 + 8 + lVar10 * 0xc);
      uVar5 = *(undefined8 *)(lVar8 + lVar11 * 0xc);
      fVar1 = *(float *)(lVar8 + 8 + lVar11 * 0xc);
      fVar26 = (float)uVar4;
      fVar23 = (float)((ulong)uVar4 >> 0x20);
      uVar4 = *(undefined8 *)(lVar8 + lVar12 * 0xc);
      fVar20 = (float)uVar4;
      fVar22 = fVar20 - fVar26;
      fVar17 = (float)uVar5;
      fVar26 = fVar26 - fVar17;
      fVar18 = (float)((ulong)uVar5 >> 0x20);
      fVar24 = fVar23 - fVar18;
      fVar2 = *(float *)(lVar8 + 8 + lVar12 * 0xc);
      fVar21 = (float)((ulong)uVar4 >> 0x20);
      fVar23 = fVar21 - fVar23;
      fVar25 = fVar2 - fVar19;
      fVar19 = fVar19 - fVar1;
      uVar4 = *(undefined8 *)(lVar8 + lVar13 * 0xc);
      fVar3 = *(float *)(lVar8 + 8 + lVar13 * 0xc);
      uVar5 = *(undefined8 *)(lVar8 + lVar10 * 0xc);
      pfVar16[-0xf] = *(float *)(lVar8 + 8 + lVar10 * 0xc);
      *(undefined8 *)(pfVar16 + -0x11) = uVar5;
      *(ulong *)(pfVar16 + -0xe) = CONCAT44(fVar24,fVar26);
      pfVar16[-0xc] = fVar19;
      *(ulong *)(pfVar16 + -0xb) = CONCAT44(fVar23,fVar22);
      pfVar16[-9] = fVar25;
      *(ulong *)(pfVar16 + -8) =
           CONCAT44(fVar21 - (float)((ulong)uVar4 >> 0x20),fVar20 - (float)uVar4);
      pfVar16[-6] = fVar2 - fVar3;
      *(ulong *)(pfVar16 + -5) = CONCAT44(fVar18 - fVar21,fVar17 - fVar20);
      pfVar16[-3] = fVar1 - fVar2;
      *(ulong *)(pfVar16 + -2) =
           CONCAT44(fVar19 * fVar22 - fVar25 * fVar26,fVar24 * fVar25 - fVar19 * fVar23);
      *pfVar16 = fVar23 * fVar26 - fVar22 * fVar24;
      pfVar16 = pfVar16 + 0x12;
      uVar14 = uVar14 + 0x20;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  return;
}

Assistant:

static void run_init_quads_task(struct parallel_task_1d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct init_primitives_task* init_primitives_task = (void*)task;
    struct quad* quads = init_primitives_task->primitives;
    const struct mesh* mesh = init_primitives_task->mesh;
    const struct vec3* vertices = mesh->attrs[ATTR_POSITION].data;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        const struct vec3* v0 = &vertices[mesh->indices[i * 4 + 0]];
        const struct vec3* v1 = &vertices[mesh->indices[i * 4 + 1]];
        const struct vec3* v2 = &vertices[mesh->indices[i * 4 + 2]];
        const struct vec3* v3 = &vertices[mesh->indices[i * 4 + 3]];
        quads[i] = make_quad(v0, v1, v2, v3);
    }
}